

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::TPZManVector
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int64_t *piVar3;
  int64_t iVar4;
  ulong uVar5;
  long lVar6;
  TPZTensor<TFad<6,_double>_> *local_90;
  TFad<6,_double> local_70;
  
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01877ca0;
  local_90 = this->fExtAlloc;
  lVar6 = 0;
  do {
    *(undefined ***)((long)this->fExtAlloc[0].fData.fExtAlloc[0].dx_ + lVar6 + -0x38) =
         &PTR__TPZTensor_018777a0;
    local_70.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
    local_70.dx_[3] = 0.0;
    local_70.dx_[4] = 0.0;
    local_70.dx_[1] = 0.0;
    local_70.dx_[2] = 0.0;
    local_70.val_ = 0.0;
    local_70.dx_[0] = 0.0;
    local_70.dx_[5] = 0.0;
    TPZManVector<TFad<6,_double>,_6>::TPZManVector
              ((TPZManVector<TFad<6,_double>,_6> *)
               ((long)this->fExtAlloc[0].fData.fExtAlloc[0].dx_ + lVar6 + -0x30),6,&local_70);
    lVar6 = lVar6 + 0x1a8;
  } while (lVar6 != 0x4f8);
  if (size < 4) {
    iVar4 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    uVar2 = SUB168(auVar1 * ZEXT816(0x1a8),0);
    uVar5 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar5 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x1a8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    piVar3 = (int64_t *)operator_new__(uVar5);
    *piVar3 = size;
    local_90 = (TPZTensor<TFad<6,_double>_> *)(piVar3 + 1);
    lVar6 = 0;
    do {
      *(undefined ***)((long)piVar3 + lVar6 + 8) = &PTR__TPZTensor_018777a0;
      local_70.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
      local_70.dx_[3] = 0.0;
      local_70.dx_[4] = 0.0;
      local_70.dx_[1] = 0.0;
      local_70.dx_[2] = 0.0;
      local_70.val_ = 0.0;
      local_70.dx_[0] = 0.0;
      local_70.dx_[5] = 0.0;
      TPZManVector<TFad<6,_double>,_6>::TPZManVector
                ((TPZManVector<TFad<6,_double>,_6> *)((long)piVar3 + lVar6 + 0x10),6,&local_70);
      lVar6 = lVar6 + 0x1a8;
      iVar4 = size;
    } while (size * 0x1a8 - lVar6 != 0);
  }
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = local_90;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = size;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = iVar4;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}